

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

M44d * Imath_3_2::procrustesRotationAndTranslation<float>
                 (M44d *__return_storage_ptr__,Vec3<float> *A,Vec3<float> *B,float *weights,
                 size_t numPoints,bool doScale)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  int i_3;
  long lVar9;
  double (*padVar10) [3];
  size_t sVar11;
  long lVar12;
  size_t i_1;
  double (*padVar13) [3];
  double (*A_00) [3];
  size_t i_2;
  float *pfVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  M33d C;
  double local_1e8;
  double dStack_1e0;
  M33d U;
  Matrix33<double> local_178;
  Matrix33<double> local_128;
  M33d Qt;
  V3d S;
  M33d V;
  
  if (numPoints == 0) {
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[0][1] = 0.0;
    __return_storage_ptr__->x[0][2] = 0.0;
    __return_storage_ptr__->x[0][3] = 0.0;
    __return_storage_ptr__->x[1][0] = 0.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[1][2] = 0.0;
    __return_storage_ptr__->x[1][3] = 0.0;
    __return_storage_ptr__->x[2][0] = 0.0;
    __return_storage_ptr__->x[2][1] = 0.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[2][3] = 0.0;
    __return_storage_ptr__->x[3][0] = 0.0;
    __return_storage_ptr__->x[3][1] = 0.0;
    __return_storage_ptr__->x[3][2] = 0.0;
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  else {
    if (weights == (float *)0x0) {
      auVar25 = ZEXT816(0);
      lVar9 = 8;
      auVar28 = ZEXT816(0);
      dVar26 = 0.0;
      dVar27 = 0.0;
      sVar11 = numPoints;
      while (bVar15 = sVar11 != 0, sVar11 = sVar11 - 1, bVar15) {
        uVar4 = *(undefined8 *)((long)A + lVar9 + -8);
        uVar5 = *(undefined8 *)((long)B + lVar9 + -8);
        dVar16 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + (double)(float)uVar4;
        auVar28._8_8_ = dVar16 + (double)(float)((ulong)uVar4 >> 0x20);
        dVar16 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + (double)(float)uVar5;
        auVar25._8_8_ = dVar16 + (double)(float)((ulong)uVar5 >> 0x20);
        dVar26 = dVar26 + (double)*(float *)((long)&B->x + lVar9);
        dVar27 = dVar27 + (double)*(float *)((long)&A->x + lVar9);
        lVar9 = lVar9 + 0xc;
      }
      auVar22._8_4_ = (int)(numPoints >> 0x20);
      auVar22._0_8_ = numPoints;
      auVar22._12_4_ = 0x45300000;
      dVar16 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)numPoints) - 4503599627370496.0);
    }
    else {
      lVar9 = 2;
      auVar25 = ZEXT816(0);
      dVar16 = 0.0;
      auVar28 = ZEXT816(0);
      dVar26 = 0.0;
      dVar27 = 0.0;
      for (sVar11 = 0; numPoints != sVar11; sVar11 = sVar11 + 1) {
        dVar19 = (double)weights[sVar11];
        dVar16 = dVar16 + dVar19;
        uVar4 = *(undefined8 *)((long)A + lVar9 * 4 + -8);
        uVar5 = *(undefined8 *)((long)B + lVar9 * 4 + -8);
        dVar18 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + (double)(float)uVar4 * dVar19;
        auVar28._8_8_ = dVar18 + (double)(float)((ulong)uVar4 >> 0x20) * dVar19;
        dVar18 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + (double)(float)uVar5 * dVar19;
        auVar25._8_8_ = dVar18 + (double)(float)((ulong)uVar5 >> 0x20) * dVar19;
        dVar26 = dVar26 + (double)(&B->x)[lVar9] * dVar19;
        dVar27 = dVar27 + (double)(&A->x)[lVar9] * dVar19;
        lVar9 = lVar9 + 3;
      }
    }
    if ((dVar16 != 0.0) || (NAN(dVar16))) {
      local_178.x[2][2] = 0.0;
      auVar23._8_8_ = dVar16;
      auVar23._0_8_ = dVar16;
      auVar28 = divpd(auVar28,auVar23);
      dVar27 = dVar27 / dVar16;
      auVar25 = divpd(auVar25,auVar23);
      dVar26 = dVar26 / dVar16;
      local_178.x[2][0] = 0.0;
      local_178.x[2][1] = 0.0;
      local_178.x[1][1] = 0.0;
      local_178.x[1][2] = 0.0;
      local_178.x[0][2] = 0.0;
      local_178.x[1][0] = 0.0;
      local_178.x[0][0] = 0.0;
      local_178.x[0][1] = 0.0;
      dVar16 = auVar28._0_8_;
      dVar19 = auVar28._8_8_;
      local_1e8 = auVar25._0_8_;
      dStack_1e0 = auVar25._8_8_;
      if (weights == (float *)0x0) {
        lVar9 = 8;
        sVar11 = numPoints;
        while (bVar15 = sVar11 != 0, sVar11 = sVar11 - 1, bVar15) {
          dVar17 = (double)*(float *)((long)&B->x + lVar9) - dVar26;
          dVar20 = (double)*(float *)((long)&A->x + lVar9) - dVar27;
          U.x[2][2] = dVar17 * dVar20;
          uVar4 = *(undefined8 *)((long)A + lVar9 + -8);
          dVar21 = (double)(float)uVar4 - dVar16;
          dVar24 = (double)(float)((ulong)uVar4 >> 0x20) - dVar19;
          uVar4 = *(undefined8 *)((long)B + lVar9 + -8);
          dVar18 = (double)(float)uVar4 - local_1e8;
          dVar8 = (double)(float)((ulong)uVar4 >> 0x20) - dStack_1e0;
          U.x[0][0] = dVar18 * dVar21;
          U.x[0][1] = dVar18 * dVar24;
          U.x[0][2] = dVar20 * dVar18;
          U.x[1][0] = dVar21 * dVar8;
          U.x[1][2]._0_4_ = SUB84(dVar8 * dVar20,0);
          U.x[1][1] = dVar8 * dVar24;
          U.x[1][2]._4_4_ = (int)((ulong)(dVar8 * dVar20) >> 0x20);
          U.x[2][0] = dVar17 * dVar21;
          U.x[2][1] = dVar17 * dVar24;
          Matrix33<double>::operator+=(&local_178,&U);
          lVar9 = lVar9 + 0xc;
        }
      }
      else {
        lVar9 = 2;
        for (sVar11 = 0; numPoints != sVar11; sVar11 = sVar11 + 1) {
          dVar20 = (double)weights[sVar11];
          dVar17 = ((double)(&B->x)[lVar9] - dVar26) * dVar20;
          dVar24 = (double)(&A->x)[lVar9] - dVar27;
          U.x[2][2] = dVar17 * dVar24;
          uVar4 = *(undefined8 *)((long)A + lVar9 * 4 + -8);
          uVar5 = *(undefined8 *)((long)B + lVar9 * 4 + -8);
          dVar18 = (double)(float)uVar4 - dVar16;
          dVar8 = (double)(float)((ulong)uVar4 >> 0x20) - dVar19;
          dVar21 = dVar20 * ((double)(float)uVar5 - local_1e8);
          dVar20 = dVar20 * ((double)(float)((ulong)uVar5 >> 0x20) - dStack_1e0);
          U.x[0][0] = dVar21 * dVar18;
          U.x[0][1] = dVar21 * dVar8;
          U.x[0][2] = dVar24 * dVar21;
          U.x[1][0] = dVar18 * dVar20;
          U.x[1][2] = dVar20 * dVar24;
          U.x[1][1] = dVar20 * dVar8;
          U.x[2][0] = dVar17 * dVar18;
          U.x[2][1] = dVar17 * dVar8;
          Matrix33<double>::operator+=(&local_178,&U);
          lVar9 = lVar9 + 3;
        }
      }
      U.x[0][0] = 1.0;
      U.x[1][0] = 0.0;
      U.x[0][1] = 0.0;
      U.x[0][2] = 0.0;
      U.x[1]._8_16_ = ZEXT816(0x3ff0000000000000);
      U.x[2][0] = 0.0;
      U.x[2][1] = 0.0;
      V.x[0][0] = 1.0;
      V.x[1][0] = 0.0;
      U.x[2][2] = 1.0;
      V.x[0][1] = 0.0;
      V.x[0][2] = 0.0;
      V.x[1][1] = 1.0;
      V.x[1][2] = 0.0;
      V.x[2][0] = 0.0;
      V.x[2][1] = 0.0;
      V.x[2][2] = 1.0;
      A_00 = (double (*) [3])&local_178;
      jacobiSVD<double>((Matrix33<double> *)A_00,&U,&S,&V,2.220446049250313e-16,true);
      local_128.x[0][0] = U.x[0][0];
      local_128.x[0][1] = U.x[1][0];
      local_128.x[0][2] = U.x[2][0];
      local_128.x[1][0] = U.x[0][1];
      local_128.x[1][1] = U.x[1][1];
      local_128.x[1][2] = U.x[2][1];
      local_128.x[2][0] = U.x[0][2];
      local_128.x[2][1] = U.x[1][2];
      local_128.x[2][2] = U.x[2][2];
      padVar13 = (double (*) [3])&Qt;
      Matrix33<double>::operator*(&V,&local_128);
      if (doScale && numPoints != 1) {
        pfVar14 = &A->z;
        dVar18 = 0.0;
        if (weights == (float *)0x0) {
          dVar8 = 0.0;
          while (bVar15 = numPoints != 0, numPoints = numPoints - 1, bVar15) {
            uVar3 = ((Vec3<float> *)(pfVar14 + -2))->x;
            uVar7 = ((Vec3<float> *)(pfVar14 + -2))->y;
            local_128.x[0][2] = (double)*pfVar14 - dVar27;
            local_128.x[0][0] = (double)(float)uVar3 - dVar16;
            local_128.x[0][1] = (double)(float)uVar7 - dVar19;
            dVar17 = Vec3<double>::length2((Vec3<double> *)&local_128);
            dVar20 = dVar8 + (dVar17 - dVar18);
            dVar18 = (dVar20 - dVar8) - (dVar17 - dVar18);
            pfVar14 = pfVar14 + 3;
            dVar8 = dVar20;
          }
        }
        else {
          dVar8 = 0.0;
          for (sVar11 = 0; numPoints != sVar11; sVar11 = sVar11 + 1) {
            fVar1 = weights[sVar11];
            uVar2 = ((Vec3<float> *)(pfVar14 + -2))->x;
            uVar6 = ((Vec3<float> *)(pfVar14 + -2))->y;
            local_128.x[0][2] = (double)*pfVar14 - dVar27;
            local_128.x[0][0] = (double)(float)uVar2 - dVar16;
            local_128.x[0][1] = (double)(float)uVar6 - dVar19;
            dVar17 = Vec3<double>::length2((Vec3<double> *)&local_128);
            dVar18 = dVar17 * (double)fVar1 - dVar18;
            dVar17 = dVar8 + dVar18;
            dVar18 = (dVar17 - dVar8) - dVar18;
            pfVar14 = pfVar14 + 3;
            dVar8 = dVar17;
          }
        }
        dVar17 = 0.0;
        dVar18 = 0.0;
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          padVar10 = padVar13;
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            dVar17 = (*(double (*) [3])*padVar10)[0] * (*(double (*) [3])*A_00)[lVar12] - dVar17;
            dVar20 = dVar18 + dVar17;
            dVar17 = (dVar20 - dVar18) - dVar17;
            padVar10 = padVar10 + 1;
            dVar18 = dVar20;
          }
          padVar13 = (double (*) [3])(*padVar13 + 1);
          A_00 = A_00 + 1;
        }
        dVar18 = dVar18 / dVar8;
      }
      else {
        dVar18 = 1.0;
      }
      dVar16 = dVar16 * dVar18;
      dVar19 = dVar19 * dVar18;
      dVar27 = dVar27 * dVar18;
      __return_storage_ptr__->x[0][0] = dVar18 * Qt.x[0][0];
      __return_storage_ptr__->x[0][1] = dVar18 * Qt.x[0][1];
      __return_storage_ptr__->x[0][2] = Qt.x[0][2] * dVar18;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = dVar18 * Qt.x[1][0];
      __return_storage_ptr__->x[1][1] = dVar18 * Qt.x[1][1];
      __return_storage_ptr__->x[1][2] = Qt.x[1][2] * dVar18;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = dVar18 * Qt.x[2][0];
      __return_storage_ptr__->x[2][1] = dVar18 * Qt.x[2][1];
      __return_storage_ptr__->x[2][2] = Qt.x[2][2] * dVar18;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] =
           local_1e8 - (dVar27 * Qt.x[2][0] + dVar16 * Qt.x[0][0] + dVar19 * Qt.x[1][0]);
      __return_storage_ptr__->x[3][1] =
           dStack_1e0 - (dVar27 * Qt.x[2][1] + dVar16 * Qt.x[0][1] + dVar19 * Qt.x[1][1]);
      __return_storage_ptr__->x[3][2] =
           dVar26 - (dVar27 * Qt.x[2][2] + dVar16 * Qt.x[0][2] + dVar19 * Qt.x[1][2]);
      __return_storage_ptr__->x[3][3] = 1.0;
    }
    else {
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[0][1] = 0.0;
      __return_storage_ptr__->x[0][2] = 0.0;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = 0.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = 0.0;
      __return_storage_ptr__->x[2][1] = 0.0;
      __return_storage_ptr__->x[2][2] = 1.0;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] = 0.0;
      __return_storage_ptr__->x[3][1] = 0.0;
      __return_storage_ptr__->x[3][2] = 0.0;
      __return_storage_ptr__->x[3][3] = 1.0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

M44d
procrustesRotationAndTranslation (
    const Vec3<T>* A,
    const Vec3<T>* B,
    const T*       weights,
    const size_t   numPoints,
    const bool     doScale)
{
    if (numPoints == 0) return M44d ();

    // Always do the accumulation in double precision:
    V3d    Acenter (0.0);
    V3d    Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0) return M44d ();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C +=
                outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d  S;
    jacobiSVD (C, U, S, V, std::numeric_limits<double>::epsilon (), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed ();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2 ();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA +=
                    ((double) weights[i]) * ((V3d) A[i] - Acenter).length2 ();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get () / traceATA.get ();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).
    const V3d translate = Bcenter - s * Acenter * Qt;

    return M44d (
        s * Qt.x[0][0],
        s * Qt.x[0][1],
        s * Qt.x[0][2],
        T (0),
        s * Qt.x[1][0],
        s * Qt.x[1][1],
        s * Qt.x[1][2],
        T (0),
        s * Qt.x[2][0],
        s * Qt.x[2][1],
        s * Qt.x[2][2],
        T (0),
        translate.x,
        translate.y,
        translate.z,
        T (1));
}